

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall logger::select_file(logger *this,string *file)

{
  size_type sVar1;
  string *file_local;
  logger *this_local;
  
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_fstream<char,_std::char_traits<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_fstream<char,_std::char_traits<char>_>_>_>_>
          ::count(&this->m_open_files,file);
  if (sVar1 != 0) {
    std::__cxx11::string::operator=((string *)&this->m_selected_file,(string *)file);
  }
  return;
}

Assistant:

void select_file(const std::string& file)
  {
    if (m_open_files.count(file))
      m_selected_file = file;
  }